

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cpp
# Opt level: O0

void __thiscall kiste::parse_context::update(parse_context *this,line_data_t *line_data)

{
  bool bVar1;
  size_t sVar2;
  line_data_t *line_data_local;
  parse_context *this_local;
  
  sVar2 = anon_unknown_6::determine_curly_level(this,line_data);
  this->_curly_level = sVar2;
  sVar2 = anon_unknown_6::determine_class_curly_level(this,line_data);
  this->_class_curly_level = sVar2;
  bVar1 = anon_unknown_6::has_trailing_return(line_data);
  this->_has_trailing_return = bVar1;
  return;
}

Assistant:

auto parse_context::update(const line_data_t& line_data) -> void
  {
    _curly_level = determine_curly_level(*this, line_data);
    _class_curly_level = determine_class_curly_level(*this, line_data);
    _has_trailing_return = ::kiste::has_trailing_return(line_data);
  }